

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_traversal.c
# Opt level: O2

void ptrobj_delete(t_ptrobj *x)

{
  t_gpointer *gp;
  t_gstub *ptVar1;
  _glist *x_00;
  t_symbol *ptVar2;
  _scalar *y;
  t_symbol *ptVar3;
  _outlet **pp_Var4;
  int iVar5;
  char *fmt;
  _outlet *x_01;
  _scalar *p_Var6;
  bool bVar7;
  
  ptVar1 = (x->x_gp).gp_stub;
  if (ptVar1 == (t_gstub *)0x0) {
    fmt = "pointer delete: no current pointer";
  }
  else if (ptVar1->gs_which == 1) {
    x_00 = (ptVar1->gs_un).gs_glist;
    if (x_00->gl_valid == (x->x_gp).gp_valid) {
      gp = &x->x_gp;
      if ((gp->gp_un).gp_scalar == (_scalar *)0x0) {
        fmt = "pointer delete: pointing to head";
      }
      else {
        ptVar2 = ((gp->gp_un).gp_scalar)->sc_template;
        ptVar3 = gensym("pd-text");
        if (ptVar2 == ptVar3) {
          fmt = "pointer delete: can\'t delete \'pd-text\' scalar";
        }
        else {
          ptVar2 = ((gp->gp_un).gp_scalar)->sc_template;
          ptVar3 = gensym("pd-float-array");
          if (ptVar2 != ptVar3) {
            y = (gp->gp_un).gp_scalar;
            p_Var6 = y;
            do {
              p_Var6 = (_scalar *)(p_Var6->sc_gobj).g_next;
              if (p_Var6 == (_scalar *)0x0) {
                glist_delete(x_00,&y->sc_gobj);
                (x->x_gp).gp_valid = x_00->gl_valid;
                gpointer_unset(gp);
                outlet_bang(x->x_bangout);
                return;
              }
            } while ((p_Var6->sc_gobj).g_pd != scalar_class);
            glist_delete(x_00,&y->sc_gobj);
            (x->x_gp).gp_valid = x_00->gl_valid;
            ptVar2 = p_Var6->sc_template;
            (x->x_gp).gp_un.gp_scalar = p_Var6;
            iVar5 = x->x_ntypedout;
            pp_Var4 = &x->x_typedout->to_outlet;
            do {
              bVar7 = iVar5 == 0;
              iVar5 = iVar5 + -1;
              if (bVar7) {
                x_01 = x->x_otherout;
LAB_0015e113:
                outlet_pointer(x_01,gp);
                return;
              }
              if (((t_typedout *)(pp_Var4 + -1))->to_type == ptVar2) {
                x_01 = *pp_Var4;
                goto LAB_0015e113;
              }
              pp_Var4 = pp_Var4 + 2;
            } while( true );
          }
          fmt = "pointer delete: can\'t delete \'pd-float-array\' scalar";
        }
      }
    }
    else {
      fmt = "pointer delete: stale pointer";
    }
  }
  else {
    fmt = "pointer delete: lists only, not arrays";
  }
  pd_error(x,fmt);
  return;
}

Assistant:

static void ptrobj_delete(t_ptrobj *x)
{
    t_gobj *gobj, *old;
    t_gpointer *gp = &x->x_gp;
    t_gstub *gs = gp->gp_stub;
    t_glist *glist;
    if (!gs)
    {
        pd_error(x, "pointer delete: no current pointer");
        return;
    }
    if (gs->gs_which != GP_GLIST)
    {
        pd_error(x, "pointer delete: lists only, not arrays");
        return;
    }
    glist = gs->gs_un.gs_glist;
    if (glist->gl_valid != gp->gp_valid)
    {
        pd_error(x, "pointer delete: stale pointer");
        return;
    }
    if (!gp->gp_un.gp_scalar)
    {
        pd_error(x, "pointer delete: pointing to head");
        return;
    }
    if (gp->gp_un.gp_scalar->sc_template == gensym("pd-text"))
    {
        pd_error(x, "pointer delete: can't delete 'pd-text' scalar");
        return;
    }
    if (gp->gp_un.gp_scalar->sc_template == gensym("pd-float-array"))
    {
        pd_error(x, "pointer delete: can't delete 'pd-float-array' scalar");
        return;
    }

    old = &gp->gp_un.gp_scalar->sc_gobj;
    gobj = old->g_next;
    while (gobj && (pd_class(&gobj->g_pd) != scalar_class))
        gobj = gobj->g_next;
    glist_delete(glist, old);
    gp->gp_valid = glist->gl_valid;
    if (gobj)
    {
        t_typedout *to;
        int n;
        t_scalar *sc = (t_scalar *)gobj;
        t_symbol *templatesym = sc->sc_template;

        gp->gp_un.gp_scalar = sc;
        for (n = x->x_ntypedout, to = x->x_typedout; n--; to++)
        {
            if (to->to_type == templatesym)
            {
                outlet_pointer(to->to_outlet, &x->x_gp);
                return;
            }
        }
        outlet_pointer(x->x_otherout, &x->x_gp);
    }
    else
    {
        gpointer_unset(gp);
        outlet_bang(x->x_bangout);
    }
}